

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topn_optimizer.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::TopN::Optimize
          (TopN *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  pointer puVar3;
  _func_int ***ppp_Var4;
  _Head_base<0UL,_duckdb::LogicalTopN_*,_false> _Var5;
  pointer pBVar6;
  bool bVar7;
  type op_00;
  pointer pLVar8;
  reference pvVar9;
  LogicalOrder *pLVar10;
  LogicalLimit *pLVar11;
  idx_t limit;
  idx_t offset;
  LogicalTopN *this_00;
  pointer pLVar12;
  type op_01;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  pointer *__ptr_1;
  TopN *this_01;
  pointer *__ptr;
  pointer puVar13;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  projections;
  _Head_base<0UL,_duckdb::LogicalTopN_*,_false> local_98;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_90;
  LogicalOperator *local_88;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_80;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  local_78;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> local_58;
  __uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> local_38;
  
  this_01 = (TopN *)&local_98;
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
       (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)this;
  op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
          operator*(in_RDX);
  bVar7 = CanOptimize(op_00);
  if (bVar7) {
    local_78.
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(in_RDX);
    pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&pLVar8->children,0);
    _Var1._M_head_impl =
         (pvVar9->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pvVar9->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    while( true ) {
      local_90._M_head_impl = _Var1._M_head_impl;
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)&local_90);
      if (pLVar8->type != LOGICAL_PROJECTION) break;
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)&local_90);
      pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&pLVar8->children,0);
      _Var1._M_head_impl =
           (pvVar9->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar9->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&local_78,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_90);
      if (local_90._M_head_impl != (LogicalOperator *)0x0) {
        ppp_Var4 = &(local_90._M_head_impl)->_vptr_LogicalOperator;
        local_90._M_head_impl = _Var1._M_head_impl;
        (*(*ppp_Var4)[1])();
        _Var1._M_head_impl = local_90._M_head_impl;
      }
    }
    pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)&local_90);
    pLVar10 = LogicalOperator::Cast<duckdb::LogicalOrder>(pLVar8);
    pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(in_RDX);
    pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&pLVar8->children,0);
    _Var2._M_head_impl = local_90._M_head_impl;
    local_90._M_head_impl = (LogicalOperator *)0x0;
    _Var1._M_head_impl =
         (pvVar9->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pvVar9->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(in_RDX);
    pLVar11 = LogicalOperator::Cast<duckdb::LogicalLimit>(pLVar8);
    limit = BoundLimitNode::GetConstantValue(&pLVar11->limit_val);
    if ((pLVar11->offset_val).type == CONSTANT_VALUE) {
      offset = BoundLimitNode::GetConstantValue(&pLVar11->offset_val);
    }
    else {
      offset = 0;
    }
    this_00 = (LogicalTopN *)operator_new(0xa0);
    local_58.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pLVar10->orders).
         super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
         super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_58.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pLVar10->orders).
         super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
         super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_58.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pLVar10->orders).
         super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
         super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (pLVar10->orders).
    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pLVar10->orders).
    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pLVar10->orders).
    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogicalTopN::LogicalTopN
              (this_00,(vector<duckdb::BoundOrderByNode,_true> *)&local_58,limit,offset);
    local_98._M_head_impl = this_00;
    ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
              (&local_58);
    pLVar12 = unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true>::
              operator->((unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true>
                          *)&local_98);
    pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&(pLVar10->super_LogicalOperator).children,0);
    local_80._M_head_impl =
         (pvVar9->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pvVar9->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    LogicalOperator::AddChild
              (&pLVar12->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_80);
    if (local_80._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_80._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_80._M_head_impl = (LogicalOperator *)0x0;
    pLVar12 = unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true>::
              operator->((unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true>
                          *)&local_98);
    pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&(pLVar12->super_LogicalOperator).children,0);
    pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar9);
    if (pLVar8->has_estimated_cardinality == true) {
      pLVar12 = unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true>::
                operator->((unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true>
                            *)&local_98);
      pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&(pLVar12->super_LogicalOperator).children,0);
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar9);
      if (pLVar8->estimated_cardinality < limit) {
        pLVar12 = unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true>::
                  operator->((unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true>
                              *)&local_98);
        pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::operator[](&(pLVar12->super_LogicalOperator).children,0);
        pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(pvVar9);
        limit = pLVar8->estimated_cardinality;
      }
    }
    op_01 = unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true>::
            operator*((unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true>
                       *)&local_98);
    PushdownDynamicFilters(this_01,op_01);
    pLVar12 = unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true>::
              operator->((unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true>
                          *)&local_98);
    LogicalOperator::SetEstimatedCardinality(&pLVar12->super_LogicalOperator,limit);
    _Var5._M_head_impl = local_98._M_head_impl;
    local_98._M_head_impl = (LogicalTopN *)0x0;
    _Var1._M_head_impl =
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         &(_Var5._M_head_impl)->super_LogicalOperator;
    if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    if (local_78.
        super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::back((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                         *)&local_78);
        local_58.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(pvVar9->
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      )._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (pvVar9->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                               *)&local_58);
        pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::operator[](&pLVar8->children,0);
        _Var1._M_head_impl =
             (in_RDX->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (in_RDX->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        _Var2._M_head_impl =
             (pvVar9->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (pvVar9->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = _Var1._M_head_impl;
        if (_Var2._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var2._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
        pBVar6 = local_58.
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_58.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _Var1._M_head_impl =
             (in_RDX->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (in_RDX->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)pBVar6;
        if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
        puVar13 = local_78.
                  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        _Var1._M_head_impl =
             local_78.
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        local_78.
        super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar13;
        if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
        (puVar13->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        if ((LogicalOperator *)
            local_58.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_start != (LogicalOperator *)0x0) {
          (*(*(_func_int ***)
              &(local_58.
                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                ._M_impl.super__Vector_impl_data._M_start)->type)[1])();
        }
      } while (local_78.
               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_78.
               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_98._M_head_impl != (LogicalTopN *)0x0) {
      (*((local_98._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
    if (local_90._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_90._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ::~vector(&local_78);
  }
  pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  puVar13 = (pLVar8->children).
            super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pLVar8->children).
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar13 != puVar3) {
    do {
      local_88 = (puVar13->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (puVar13->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      Optimize((TopN *)&local_58,op);
      _Var1._M_head_impl =
           (puVar13->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (puVar13->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)
           local_58.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      if (local_88 != (LogicalOperator *)0x0) {
        (*local_88->_vptr_LogicalOperator[1])();
      }
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar3);
  }
  *(LogicalOperator **)
   local_38._M_t.
   super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
   super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (in_RDX->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (in_RDX->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> TopN::Optimize(unique_ptr<LogicalOperator> op) {
	if (CanOptimize(*op)) {

		vector<unique_ptr<LogicalOperator>> projections;

		// traverse operator tree and collect all projection nodes until we reach
		// the order by operator

		auto child = std::move(op->children[0]);
		// collect all projections until we get to the order by
		while (child->type == LogicalOperatorType::LOGICAL_PROJECTION) {
			D_ASSERT(!child->children.empty());
			auto tmp = std::move(child->children[0]);
			projections.push_back(std::move(child));
			child = std::move(tmp);
		}
		D_ASSERT(child->type == LogicalOperatorType::LOGICAL_ORDER_BY);
		auto &order_by = child->Cast<LogicalOrder>();

		// Move order by operator into children of limit operator
		op->children[0] = std::move(child);

		auto &limit = op->Cast<LogicalLimit>();
		auto limit_val = limit.limit_val.GetConstantValue();
		idx_t offset_val = 0;
		if (limit.offset_val.Type() == LimitNodeType::CONSTANT_VALUE) {
			offset_val = limit.offset_val.GetConstantValue();
		}
		auto topn = make_uniq<LogicalTopN>(std::move(order_by.orders), limit_val, offset_val);
		topn->AddChild(std::move(order_by.children[0]));
		auto cardinality = limit_val;
		if (topn->children[0]->has_estimated_cardinality && topn->children[0]->estimated_cardinality < limit_val) {
			cardinality = topn->children[0]->estimated_cardinality;
		}
		PushdownDynamicFilters(*topn);
		topn->SetEstimatedCardinality(cardinality);
		op = std::move(topn);

		// reconstruct all projection nodes above limit operator
		while (!projections.empty()) {
			auto node = std::move(projections.back());
			node->children[0] = std::move(op);
			op = std::move(node);
			projections.pop_back();
		}
	}

	for (auto &child : op->children) {
		child = Optimize(std::move(child));
	}
	return op;
}